

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsMotorSpeed.cpp
# Opt level: O1

void __thiscall
chrono::ChShaftsMotorSpeed::IntToDescriptor
          (ChShaftsMotorSpeed *this,uint off_v,ChStateDelta *v,ChVectorDynamic<> *R,uint off_L,
          ChVectorDynamic<> *L,ChVectorDynamic<> *Qc)

{
  double dVar1;
  ulong uVar2;
  double *local_38;
  long local_30;
  
  uVar2 = (ulong)off_L;
  if ((long)uVar2 <
      (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
    (this->constraint).super_ChConstraintTwo.super_ChConstraint.l_i =
         (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data[uVar2]
    ;
    if ((long)uVar2 <
        (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
      (this->constraint).super_ChConstraintTwo.super_ChConstraint.b_i =
           (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
           [uVar2];
      uVar2 = (ulong)off_v;
      if ((long)uVar2 <
          (v->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        dVar1 = (v->super_ChVectorDynamic<double>).
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                [uVar2];
        ChVariables::Get_qb((ChVectorRef *)&local_38,&(this->variable).super_ChVariables);
        if (0 < local_30) {
          *local_38 = dVar1;
          if ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              <= (long)uVar2) goto LAB_005ea51f;
          dVar1 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_data[uVar2];
          ChVariables::Get_fb((ChVectorRef *)&local_38,&(this->variable).super_ChVariables);
          if (0 < local_30) {
            *local_38 = dVar1;
            return;
          }
        }
        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 1>::operator()(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 1]"
                     );
      }
    }
  }
LAB_005ea51f:
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

void ChShaftsMotorSpeed::IntToDescriptor(const unsigned int off_v,  // offset in v, R
                                    const ChStateDelta& v,
                                    const ChVectorDynamic<>& R,
                                    const unsigned int off_L,  // offset in L, Qc
                                    const ChVectorDynamic<>& L,
                                    const ChVectorDynamic<>& Qc) {
     constraint.Set_l_i(L(off_L));
     constraint.Set_b_i(Qc(off_L));

     this->variable.Get_qb()(0, 0) = v(off_v);
     this->variable.Get_fb()(0, 0) = R(off_v);
}